

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

space_info * ghc::filesystem::space(space_info *__return_storage_ptr__,path *p)

{
  filesystem_error *this;
  error_code ec_00;
  error_code ec;
  error_code local_50;
  string local_40;
  
  local_50._M_value = 0;
  local_50._M_cat = (error_category *)std::_V2::system_category();
  space(__return_storage_ptr__,p,&local_50);
  if (local_50._M_value == 0) {
    return __return_storage_ptr__;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  detail::systemErrorText<int>(&local_40,local_50._M_value);
  ec_00._4_4_ = 0;
  ec_00._M_value = local_50._M_value;
  ec_00._M_cat = local_50._M_cat;
  filesystem_error::filesystem_error(this,&local_40,p,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE space_info space(const path& p)
{
    std::error_code ec;
    auto result = space(p, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
    return result;
}